

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

precise_unit units::default_unit(string *unit_type)

{
  char cVar1;
  pointer pcVar2;
  ulong uVar3;
  precise_unit pVar4;
  int iVar5;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var6;
  const_iterator cVar7;
  size_type sVar8;
  size_type sVar9;
  size_type sVar10;
  bool bVar11;
  precise_unit pVar12;
  precise_unit pVar13;
  precise_unit tunit;
  undefined1 local_1a8 [8];
  ulong local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  string local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if ((default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_)
     , iVar5 != 0)) {
    loadDefinedMeasurementTypes_abi_cxx11_();
    __cxa_atexit(std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
                 ::~unordered_map,&default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_);
  }
  sVar8 = unit_type->_M_string_length;
  if (sVar8 != 1) goto switchD_003ee859_caseD_4b;
  cVar1 = *(unit_type->_M_dataplus)._M_p;
  switch(cVar1) {
  case 'I':
    pVar12.base_units_ = (unit_data)0x800;
    pVar12.commodity_ = 0;
    pVar12.multiplier_ = 1.0;
    break;
  case 'J':
    pVar12.base_units_ = (unit_data)0x4000;
    pVar12.commodity_ = 0;
    pVar12.multiplier_ = 1.0;
    break;
  case 'K':
  case 'O':
  case 'P':
  case 'Q':
  case 'R':
  case 'S':
    goto switchD_003ee859_caseD_4b;
  case 'L':
    pVar12.base_units_ = (unit_data)0x1;
    pVar12.commodity_ = 0;
    pVar12.multiplier_ = 1.0;
    break;
  case 'M':
    pVar12.base_units_ = (unit_data)0x100;
    pVar12.commodity_ = 0;
    pVar12.multiplier_ = 1.0;
    break;
  case 'N':
    pVar12.base_units_ = (unit_data)0x80000;
    pVar12.commodity_ = 0;
    pVar12.multiplier_ = 1.0;
    break;
  case 'T':
    pVar12.base_units_ = (unit_data)0x10;
    pVar12.commodity_ = 0;
    pVar12.multiplier_ = 1.0;
    break;
  default:
    if (cVar1 == -0x38) {
      pVar13.base_units_ = (unit_data)0x10000;
      pVar13.commodity_ = 0;
      pVar13.multiplier_ = 1.0;
      return pVar13;
    }
switchD_003ee859_caseD_4b:
    if (sVar8 != 0) {
      pcVar2 = (unit_type->_M_dataplus)._M_p;
      sVar10 = 0;
      do {
        iVar5 = tolower((int)pcVar2[sVar10]);
        pcVar2[sVar10] = (char)iVar5;
        sVar10 = sVar10 + 1;
      } while (sVar8 != sVar10);
    }
    _Var6._M_current = (unit_type->_M_dataplus)._M_p;
    local_1a8[0] = 0x20;
    _Var6 = std::
            __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (_Var6,_Var6._M_current + unit_type->_M_string_length,
                       (_Iter_equals_val<const_char>)local_1a8);
    unit_type->_M_string_length = (long)_Var6._M_current - (long)(unit_type->_M_dataplus)._M_p;
    *_Var6._M_current = '\0';
    cVar7 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_._M_h,unit_type)
    ;
    if (cVar7.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
        ._M_cur != (__node_type *)0x0) {
      return *(precise_unit *)
              ((long)cVar7.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
                     ._M_cur + 0x28);
    }
    iVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_type,0
                    ,10,"quantityof");
    if (iVar5 == 0) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_type,10,
                 0xffffffffffffffff);
      pVar12 = default_unit((string *)&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p == &local_48.field_2) {
        return pVar12;
      }
    }
    else {
      iVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_type
                      ,0,6,"rateof");
      if (iVar5 == 0) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_type,6,
                   0xffffffffffffffff);
        _local_1a8 = default_unit((string *)&local_68);
        pVar12 = precise_unit::operator/((precise_unit *)local_1a8,(precise_unit *)precise::s);
        local_48.field_2._M_allocated_capacity = local_68.field_2._M_allocated_capacity;
        local_48._M_dataplus._M_p = local_68._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p == &local_68.field_2) {
          return pVar12;
        }
      }
      else {
        sVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                rfind(unit_type,"of",0xffffffffffffffff,2);
        if (sVar8 == 0xffffffffffffffff) {
          sVar9 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find_first_of
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             unit_type,"([{",0,3);
          if (sVar9 == 0xffffffffffffffff) {
            iVar5 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               unit_type,0,3,"inv");
            if (iVar5 == 0) {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              substr(&local_c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_type,
                     3,0xffffffffffffffff);
              _local_1a8 = default_unit((string *)&local_c8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1
                               );
              }
              uVar3 = local_1a0;
              bVar11 = local_1a0._0_4_ != (unit_data)0xfa94a488;
              local_1a0 = uVar3;
              if (bVar11 && !NAN((double)local_1a8)) {
                pVar13 = precise_unit::inv((precise_unit *)local_1a8);
                return pVar13;
              }
            }
            local_1a8 = (undefined1  [8])&local_198;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"rto","");
            sVar9 = unit_type->_M_string_length - local_1a0;
            if (unit_type->_M_string_length < local_1a0 || sVar9 == 0) {
              bVar11 = false;
            }
            else {
              iVar5 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                (unit_type,sVar9,local_1a0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_1a8);
              bVar11 = iVar5 == 0;
            }
            if (local_1a8 != (undefined1  [8])&local_198) {
              operator_delete((void *)local_1a8,local_198._M_allocated_capacity + 1);
            }
            if (bVar11) {
LAB_003eec5c:
              return (precise_unit)ZEXT816(0x3ff0000000000000);
            }
            local_1a8 = (undefined1  [8])&local_198;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"fr","");
            sVar9 = unit_type->_M_string_length - local_1a0;
            if (unit_type->_M_string_length < local_1a0 || sVar9 == 0) {
              bVar11 = false;
            }
            else {
              iVar5 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                (unit_type,sVar9,local_1a0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_1a8);
              bVar11 = iVar5 == 0;
            }
            if (local_1a8 != (undefined1  [8])&local_198) {
              operator_delete((void *)local_1a8,local_198._M_allocated_capacity + 1);
            }
            if (bVar11) goto LAB_003eec5c;
            local_1a8 = (undefined1  [8])&local_198;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"quantity","");
            sVar9 = unit_type->_M_string_length - local_1a0;
            if (unit_type->_M_string_length < local_1a0 || sVar9 == 0) {
              bVar11 = false;
            }
            else {
              iVar5 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                (unit_type,sVar9,local_1a0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_1a8);
              bVar11 = iVar5 == 0;
            }
            if (local_1a8 != (undefined1  [8])&local_198) {
              operator_delete((void *)local_1a8,local_198._M_allocated_capacity + 1);
            }
            if (bVar11) {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              substr(&local_e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_type,
                     0,unit_type->_M_string_length - 8);
              pVar12 = default_unit((string *)&local_e8);
              local_48.field_2._M_allocated_capacity = local_e8.field_2._M_allocated_capacity;
              local_48._M_dataplus._M_p = local_e8._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8._M_dataplus._M_p == &local_e8.field_2) {
                return pVar12;
              }
            }
            else {
              local_1a8 = (undefined1  [8])&local_198;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"quantities","");
              sVar9 = unit_type->_M_string_length - local_1a0;
              if (unit_type->_M_string_length < local_1a0 || sVar9 == 0) {
                bVar11 = false;
              }
              else {
                iVar5 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                  (unit_type,sVar9,local_1a0,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_1a8);
                bVar11 = iVar5 == 0;
              }
              if (local_1a8 != (undefined1  [8])&local_198) {
                operator_delete((void *)local_1a8,local_198._M_allocated_capacity + 1);
              }
              if (bVar11) {
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::substr(&local_108,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         unit_type,0,unit_type->_M_string_length - 10);
                pVar12 = default_unit((string *)&local_108);
                local_48.field_2._M_allocated_capacity = local_108.field_2._M_allocated_capacity;
                local_48._M_dataplus._M_p = local_108._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_108._M_dataplus._M_p == &local_108.field_2) {
                  return pVar12;
                }
              }
              else {
                local_1a8 = (undefined1  [8])&local_198;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"measure","");
                sVar9 = unit_type->_M_string_length - local_1a0;
                if (unit_type->_M_string_length < local_1a0 || sVar9 == 0) {
                  bVar11 = false;
                }
                else {
                  iVar5 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                    (unit_type,sVar9,local_1a0,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_1a8);
                  bVar11 = iVar5 == 0;
                }
                if (local_1a8 != (undefined1  [8])&local_198) {
                  operator_delete((void *)local_1a8,local_198._M_allocated_capacity + 1);
                }
                if (bVar11) {
                  CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                            (&local_128,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             unit_type,0,unit_type->_M_string_length - 7);
                  pVar12 = default_unit((string *)&local_128);
                  local_48.field_2._M_allocated_capacity = local_128.field_2._M_allocated_capacity;
                  local_48._M_dataplus._M_p = local_128._M_dataplus._M_p;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_128._M_dataplus._M_p == &local_128.field_2) {
                    return pVar12;
                  }
                }
                else {
                  local_1a8 = (undefined1  [8])&local_198;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"size","");
                  sVar9 = unit_type->_M_string_length - local_1a0;
                  if (unit_type->_M_string_length < local_1a0 || sVar9 == 0) {
                    bVar11 = false;
                  }
                  else {
                    iVar5 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            compare(unit_type,sVar9,local_1a0,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_1a8);
                    bVar11 = iVar5 == 0;
                  }
                  if (local_1a8 != (undefined1  [8])&local_198) {
                    operator_delete((void *)local_1a8,local_198._M_allocated_capacity + 1);
                  }
                  uVar3 = unit_type->_M_string_length;
                  if (bVar11) {
                    CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                              (&local_148,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               unit_type,0,uVar3 - 4);
                    pVar12 = default_unit((string *)&local_148);
                    local_48.field_2._M_allocated_capacity = local_148.field_2._M_allocated_capacity
                    ;
                    local_48._M_dataplus._M_p = local_148._M_dataplus._M_p;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_148._M_dataplus._M_p == &local_148.field_2) {
                      return pVar12;
                    }
                  }
                  else if ((uVar3 < 2) || ((unit_type->_M_dataplus)._M_p[uVar3 - 1] != 's')) {
                    local_1a8 = (undefined1  [8])&local_198;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"rate","");
                    sVar9 = unit_type->_M_string_length - local_1a0;
                    if (unit_type->_M_string_length < local_1a0 || sVar9 == 0) {
                      bVar11 = false;
                    }
                    else {
                      iVar5 = std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                              compare(unit_type,sVar9,local_1a0,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_1a8);
                      bVar11 = iVar5 == 0;
                    }
                    if (local_1a8 != (undefined1  [8])&local_198) {
                      operator_delete((void *)local_1a8,local_198._M_allocated_capacity + 1);
                    }
                    if (!bVar11) {
                      pVar4.base_units_ = (unit_data)0xfa94a488;
                      pVar4.commodity_ = 0;
                      pVar4.multiplier_ = NAN;
                      return pVar4;
                    }
                    CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                              (&local_168,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               unit_type,0,unit_type->_M_string_length - 4);
                    _local_1a8 = default_unit((string *)&local_168);
                    pVar12 = precise_unit::operator/
                                       ((precise_unit *)local_1a8,(precise_unit *)precise::s);
                    local_48.field_2._M_allocated_capacity = local_168.field_2._M_allocated_capacity
                    ;
                    local_48._M_dataplus._M_p = local_168._M_dataplus._M_p;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_168._M_dataplus._M_p == &local_168.field_2) {
                      return pVar12;
                    }
                  }
                  else {
                    CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               unit_type);
                    pcVar2 = (unit_type->_M_dataplus)._M_p;
                    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_188,pcVar2,pcVar2 + unit_type->_M_string_length);
                    pVar12 = default_unit(&local_188);
                    local_48.field_2._M_allocated_capacity = local_188.field_2._M_allocated_capacity
                    ;
                    local_48._M_dataplus._M_p = local_188._M_dataplus._M_p;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_188._M_dataplus._M_p == &local_188.field_2) {
                      return pVar12;
                    }
                  }
                }
              }
            }
          }
          else {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            substr(&local_a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_type,0,
                   sVar9);
            pVar12 = default_unit((string *)&local_a8);
            local_48.field_2._M_allocated_capacity = local_a8.field_2._M_allocated_capacity;
            local_48._M_dataplus._M_p = local_a8._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p == &local_a8.field_2) {
              return pVar12;
            }
          }
        }
        else {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          substr(&local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_type,0,
                 sVar8);
          pVar12 = default_unit((string *)&local_88);
          local_48.field_2._M_allocated_capacity = local_88.field_2._M_allocated_capacity;
          local_48._M_dataplus._M_p = local_88._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p == &local_88.field_2) {
            return pVar12;
          }
        }
      }
    }
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return pVar12;
}

Assistant:

precise_unit default_unit(std::string unit_type)
{
    static const smap measurement_types = loadDefinedMeasurementTypes();

    if (unit_type.size() == 1) {
        switch (unit_type[0]) {
            case 'L':
                return precise::m;
            case 'M':
                return precise::kg;
            case 'T':
                return precise::second;
            case '\xC8':
                return precise::Kelvin;
            case 'I':
                return precise::A;
            case 'N':
                return precise::mol;
            case 'J':
                return precise::cd;
        }
    }
    std::transform(
        unit_type.begin(), unit_type.end(), unit_type.begin(), ::tolower);
    unit_type.erase(
        std::remove(unit_type.begin(), unit_type.end(), ' '), unit_type.end());
    auto fnd = measurement_types.find(unit_type);
    if (fnd != measurement_types.end()) {
        return fnd->second;
    }
    if (unit_type.compare(0, 10, "quantityof") == 0) {
        return default_unit(unit_type.substr(10));
    }
    if (unit_type.compare(0, 6, "rateof") == 0) {
        return default_unit(unit_type.substr(6)) / precise::s;
    }
    auto fof = unit_type.rfind("of");
    if (fof != std::string::npos) {
        return default_unit(unit_type.substr(0, fof));
    }
    fof = unit_type.find_first_of("([{");
    if (fof != std::string::npos) {
        return default_unit(unit_type.substr(0, fof));
    }
    if (unit_type.compare(0, 3, "inv") == 0) {
        auto tunit = default_unit(unit_type.substr(3));
        if (!is_error(tunit)) {
            return tunit.inv();
        }
    }
    if (ends_with(unit_type, "rto")) {
        // ratio of some kind
        return precise::one;
    }
    if (ends_with(unit_type, "fr")) {
        // ratio of some kind
        return precise::one;
    }
    if (ends_with(unit_type, "quantity")) {
        return default_unit(
            unit_type.substr(0, unit_type.size() - strlen("quantity")));
    }
    if (ends_with(unit_type, "quantities")) {
        return default_unit(
            unit_type.substr(0, unit_type.size() - strlen("quantities")));
    }
    if (ends_with(unit_type, "measure")) {
        return default_unit(
            unit_type.substr(0, unit_type.size() - strlen("measure")));
    }
    if (ends_with(unit_type, "size")) {
        return default_unit(
            unit_type.substr(0, unit_type.size() - strlen("size")));
    }
    if (unit_type.back() == 's' && unit_type.size() > 1) {
        unit_type.pop_back();
        return default_unit(unit_type);
    }
    if (ends_with(unit_type, "rate")) {
        return default_unit(
                   unit_type.substr(0, unit_type.size() - strlen("rate"))) /
            precise::s;
    }
    return precise::invalid;
}